

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraCommands.cpp
# Opt level: O0

ResponseLine * __thiscall
IRCConnectGenericCommand::trigger(IRCConnectGenericCommand *this,string_view parameters)

{
  bool bVar1;
  long lVar2;
  ResponseLine *pRVar3;
  ulong uVar4;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  size_t local_d8;
  char *local_d0;
  size_t local_c8;
  char *local_c0;
  size_t local_a8;
  char *local_a0;
  size_t local_98;
  char *local_90;
  IRC_Bot *server;
  char *local_68;
  size_t local_60;
  char *local_58;
  size_t local_40;
  char *local_38;
  long local_30;
  IRC_Bot *server_1;
  IRCConnectGenericCommand *this_local;
  string_view parameters_local;
  
  parameters_local._M_len = (size_t)parameters._M_str;
  this_local = (IRCConnectGenericCommand *)parameters._M_len;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (bVar1) {
    if (IRCCommand::selected_server == 0) {
      if (IRCCommand::active_server == 0) {
        pRVar3 = (ResponseLine *)operator_new(0x30);
        bVar5 = sv("Error: No IRC server is currently selected.",0x2b);
        local_40 = bVar5._M_len;
        local_38 = bVar5._M_str;
        Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar3,local_40,local_38,2);
        return pRVar3;
      }
      local_30 = IRCCommand::active_server;
    }
    else {
      local_30 = IRCCommand::selected_server;
    }
    bVar5 = sv("Connect command used; reconnecting...",0x25);
    local_60 = bVar5._M_len;
    local_58 = bVar5._M_str;
    Jupiter::IRC::Client::disconnect(local_30,local_60,local_58);
    pRVar3 = (ResponseLine *)operator_new(0x30);
    bVar5 = sv("Disconnected from IRC server.",0x1d);
    server = (IRC_Bot *)bVar5._M_len;
    local_68 = bVar5._M_str;
    Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar3,server,local_68,0);
    parameters_local._M_str = (char *)pRVar3;
  }
  else {
    lVar2 = ServerManager::getServer(_serverManager,this_local,parameters_local._M_len);
    if (lVar2 == 0) {
      uVar4 = ServerManager::addServer(_serverManager,this_local,parameters_local._M_len);
      if ((uVar4 & 1) == 0) {
        pRVar3 = (ResponseLine *)operator_new(0x30);
        bVar5 = sv("Error: Unable to find configuration settings for server, or connection refused."
                   ,0x4f);
        local_d8 = bVar5._M_len;
        local_d0 = bVar5._M_str;
        Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar3,local_d8,local_d0,2);
        parameters_local._M_str = (char *)pRVar3;
      }
      else {
        pRVar3 = (ResponseLine *)operator_new(0x30);
        bVar5 = sv("Connection successfully established; server added to server list.",0x41);
        local_c8 = bVar5._M_len;
        local_c0 = bVar5._M_str;
        Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar3,local_c8,local_c0,0);
        parameters_local._M_str = (char *)pRVar3;
      }
    }
    else {
      bVar5 = sv("Connect command used; reconnecting...",0x25);
      local_98 = bVar5._M_len;
      local_90 = bVar5._M_str;
      Jupiter::IRC::Client::disconnect(lVar2,local_98,local_90);
      pRVar3 = (ResponseLine *)operator_new(0x30);
      bVar5 = sv("Disconnected from IRC server.",0x1d);
      local_a8 = bVar5._M_len;
      local_a0 = bVar5._M_str;
      Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar3,local_a8,local_a0,0);
      parameters_local._M_str = (char *)pRVar3;
    }
  }
  return (ResponseLine *)parameters_local._M_str;
}

Assistant:

Jupiter::GenericCommand::ResponseLine *IRCConnectGenericCommand::trigger(std::string_view parameters)
{
	if (parameters.empty())
	{
		IRC_Bot *server;
		if (IRCCommand::selected_server != nullptr)
			server = IRCCommand::selected_server;
		else if (IRCCommand::active_server != nullptr)
			server = IRCCommand::active_server;
		else
			return new Jupiter::GenericCommand::ResponseLine("Error: No IRC server is currently selected."sv, GenericCommand::DisplayType::PublicError);

		server->disconnect("Connect command used; reconnecting..."sv, false);
		return new Jupiter::GenericCommand::ResponseLine("Disconnected from IRC server."sv, GenericCommand::DisplayType::PublicSuccess);
	}
	IRC_Bot *server = serverManager->getServer(parameters);
	if (server != nullptr)
	{
		server->disconnect("Connect command used; reconnecting..."sv, false);
		return new Jupiter::GenericCommand::ResponseLine("Disconnected from IRC server."sv, GenericCommand::DisplayType::PublicSuccess);
	}
	if (serverManager->addServer(parameters))
		return new Jupiter::GenericCommand::ResponseLine("Connection successfully established; server added to server list."sv, GenericCommand::DisplayType::PublicSuccess);
	return new Jupiter::GenericCommand::ResponseLine("Error: Unable to find configuration settings for server, or connection refused."sv, GenericCommand::DisplayType::PublicError);
}